

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChDirectSolverLS.cpp
# Opt level: O1

void __thiscall
chrono::ChDirectSolverLS::WriteMatrix(ChDirectSolverLS *this,string *filename,ChSparseMatrix *M)

{
  StorageIndex *pSVar1;
  long lVar2;
  ChStreamOutAscii *pCVar3;
  long lVar4;
  StorageIndex SVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ChStreamOutAsciiFile file;
  double local_328;
  ChStreamOutAsciiFile local_320;
  
  ChStreamOutAsciiFile::ChStreamOutAsciiFile(&local_320,(filename->_M_dataplus)._M_p,_S_trunc);
  builtin_strncpy(local_320.super_ChStreamOutAscii.number_format,"%.12g",6);
  if (0 < M->m_outerSize) {
    lVar9 = 0;
    do {
      lVar2 = M->m_innerSize;
      if (0 < lVar2) {
        uVar10 = 0;
        do {
          if (M->m_outerSize <= lVar9) {
            __assert_fail("row>=0 && row<rows() && col>=0 && col<cols()",
                          "/usr/include/eigen3/Eigen/src/SparseCore/SparseMatrix.h",0xc0,
                          "Scalar Eigen::SparseMatrix<double, 1>::coeff(Index, Index) const [_Scalar = double, _Options = 1, _StorageIndex = int]"
                         );
          }
          if (M->m_innerNonZeros == (StorageIndex *)0x0) {
            SVar5 = M->m_outerIndex[lVar9 + 1];
          }
          else {
            SVar5 = M->m_innerNonZeros[lVar9] + M->m_outerIndex[lVar9];
          }
          lVar4 = (long)M->m_outerIndex[lVar9];
          local_328 = 0.0;
          if (M->m_outerIndex[lVar9] < SVar5) {
            lVar6 = (long)SVar5;
            pSVar1 = (M->m_data).m_indices;
            lVar8 = lVar6 + -1;
            if (uVar10 != (uint)pSVar1[lVar6 + -1]) {
              while (lVar7 = lVar8, lVar4 < lVar7) {
                lVar8 = lVar7 + lVar4 >> 1;
                if ((long)pSVar1[lVar8] < (long)uVar10) {
                  lVar4 = lVar8 + 1;
                  lVar8 = lVar7;
                }
              }
              if ((lVar6 <= lVar4) || (lVar8 = lVar4, uVar10 != (uint)pSVar1[lVar4]))
              goto LAB_007b4d5b;
            }
            local_328 = (M->m_data).m_values[lVar8];
          }
LAB_007b4d5b:
          if (((local_328 != 0.0) || (NAN(local_328))) ||
             (lVar2 - 1U == uVar10 && M->m_outerSize + -1 == lVar9)) {
            pCVar3 = ChStreamOutAscii::operator<<(&local_320.super_ChStreamOutAscii,(int)lVar9 + 1);
            pCVar3 = ChStreamOutAscii::operator<<(pCVar3," ");
            pCVar3 = ChStreamOutAscii::operator<<(pCVar3,(int)uVar10 + 1);
            pCVar3 = ChStreamOutAscii::operator<<(pCVar3," ");
            pCVar3 = ChStreamOutAscii::operator<<(pCVar3,local_328);
            ChStreamOutAscii::operator<<(pCVar3,"\n");
          }
          uVar10 = uVar10 + 1;
          lVar2 = M->m_innerSize;
        } while ((long)uVar10 < lVar2);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < M->m_outerSize);
  }
  ChStreamOutAsciiFile::~ChStreamOutAsciiFile(&local_320);
  return;
}

Assistant:

void ChDirectSolverLS::WriteMatrix(const std::string& filename, const ChSparseMatrix& M) {
    ChStreamOutAsciiFile file(filename.c_str());
    file.SetNumFormat("%.12g");
    for (int i = 0; i < M.rows(); i++) {
        for (int j = 0; j < M.cols(); j++) {
            double elVal = M.coeff(i, j);
            if (elVal || (i == M.rows() - 1 && j == M.cols() - 1)) {
                file << i + 1 << " " << j + 1 << " " << elVal << "\n";
            }
        }
    }
}